

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O3

int mbedtls_hmac_drbg_write_seed_file(mbedtls_hmac_drbg_context *ctx,char *path)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  mbedtls_hmac_drbg_context *ctx_1;
  uchar buf [256];
  uchar auStack_128 [264];
  
  __s = fopen(path,"wb");
  if (__s == (FILE *)0x0) {
    iVar1 = -7;
  }
  else {
    iVar1 = mbedtls_hmac_drbg_random_with_add(ctx,auStack_128,0x100,(uchar *)0x0,0);
    if (iVar1 == 0) {
      sVar2 = fwrite(auStack_128,1,0x100,__s);
      iVar1 = -7;
      if (sVar2 == 0x100) {
        iVar1 = 0;
      }
    }
    fclose(__s);
  }
  return iVar1;
}

Assistant:

int mbedtls_hmac_drbg_write_seed_file( mbedtls_hmac_drbg_context *ctx, const char *path )
{
    int ret;
    FILE *f;
    unsigned char buf[ MBEDTLS_HMAC_DRBG_MAX_INPUT ];

    if( ( f = fopen( path, "wb" ) ) == NULL )
        return( MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR );

    if( ( ret = mbedtls_hmac_drbg_random( ctx, buf, sizeof( buf ) ) ) != 0 )
        goto exit;

    if( fwrite( buf, 1, sizeof( buf ), f ) != sizeof( buf ) )
    {
        ret = MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR;
        goto exit;
    }

    ret = 0;

exit:
    fclose( f );
    return( ret );
}